

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::SampleStencilCase::iterate(SampleStencilCase *this)

{
  int iVar1;
  bool bVar2;
  GLenum GVar3;
  deBool dVar4;
  int iVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  TestContext *pTVar7;
  float fVar8;
  float fVar9;
  char *local_e00;
  MessageBuilder local_c98;
  RGBA local_b18;
  byte local_b12;
  allocator<char> local_b11;
  undefined1 local_b10 [6];
  bool passed;
  allocator<char> local_ae9;
  string local_ae8;
  LogImage local_ac8;
  Vector<float,_4> local_a38;
  Vector<float,_2> local_a28;
  Vector<float,_2> local_a20;
  Vector<float,_2> local_a18;
  Vector<float,_2> local_a10;
  MessageBuilder local_a08;
  int local_888;
  allocator<char> local_881;
  string local_880;
  allocator<char> local_859;
  string local_858;
  LogImage local_838;
  MessageBuilder local_7a8;
  RGBA local_628;
  RGBA local_624;
  RGBA *local_620;
  RGBA *clr;
  int x;
  int y;
  Surface clearedImg;
  MessageBuilder local_478;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  LogImage local_2a8;
  Vector<float,_4> local_218;
  Vector<float,_2> local_208;
  Vector<float,_2> local_200;
  Vector<float,_2> local_1f8;
  float local_1f0;
  float local_1ec;
  float angle1;
  float angle0;
  int i;
  int numTriangles;
  undefined1 local_50 [8];
  Surface renderedImgSecond;
  Surface renderedImgFirst;
  TestLog *log;
  SampleStencilCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  iVar1 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)&renderedImgSecond.m_pixels.m_cap,iVar1,iVar1);
  iVar1 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)local_50,iVar1,iVar1);
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  do {
    glwClearColor(0.0,0.0,0.0,1.0);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x473);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwClearStencil(0);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glClearStencil(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x474);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwClear(0x4400);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x475);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwEnable(0xb90);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glEnable(GL_STENCIL_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x476);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwStencilFunc(0x207,1,1);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glStencilFunc(GL_ALWAYS, 1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x477);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwStencilOp(0x1e00,0x1e00,0x1e01);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x478);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::TestLog::operator<<((MessageBuilder *)&i,this_00,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&i,
                      (char (*) [100])
                      "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)"
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i);
  angle0 = 3.50325e-44;
  for (angle1 = 0.0; (int)angle1 < 0x19; angle1 = (float)((int)angle1 + 1)) {
    local_1ec = ((float)(int)angle1 * 6.2831855) / 25.0;
    local_1f0 = (((float)(int)angle1 + 0.5) * 6.2831855) / 25.0;
    tcu::Vector<float,_2>::Vector(&local_1f8,0.0,0.0);
    fVar8 = deFloatCos(local_1ec);
    fVar9 = deFloatSin(local_1ec);
    tcu::Vector<float,_2>::Vector(&local_200,fVar8 * 0.95,fVar9 * 0.95);
    fVar8 = deFloatCos(local_1f0);
    fVar9 = deFloatSin(local_1f0);
    tcu::Vector<float,_2>::Vector(&local_208,fVar8 * 0.95,fVar9 * 0.95);
    tcu::Vector<float,_4>::Vector(&local_218,1.0);
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,&local_1f8,&local_200,&local_208,&local_218);
  }
  MultisampleCase::readImage
            (&this->super_MultisampleCase,(Surface *)&renderedImgSecond.m_pixels.m_cap);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"RenderedImgFirst",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"First image rendered",&local_2f1);
  tcu::LogImage::LogImage
            (&local_2a8,&local_2c8,&local_2f0,(Surface *)&renderedImgSecond.m_pixels.m_cap,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::TestLog::operator<<(this_00,&local_2a8);
  tcu::LogImage::~LogImage(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  tcu::TestLog::operator<<(&local_478,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_478,(char (*) [31])"Clearing color buffer to black");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_478);
  do {
    glwClear(0x4000);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glClear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x48f);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwStencilFunc(0x202,1,1);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glStencilFunc(GL_EQUAL, 1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x490);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    glwStencilOp(0x1e00,0x1e00,0x1e00);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x491);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&clearedImg.m_pixels.m_cap,this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&clearedImg.m_pixels.m_cap,
                      (char (*) [57])"Checking that color buffer was actually cleared to black");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&clearedImg.m_pixels.m_cap);
  iVar1 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)&x,iVar1,iVar1);
  MultisampleCase::readImage(&this->super_MultisampleCase,(Surface *)&x);
  clr._4_4_ = 0;
  do {
    iVar1 = clr._4_4_;
    iVar5 = tcu::Surface::getHeight((Surface *)&x);
    if (iVar5 <= iVar1) {
      local_888 = 0;
LAB_00a4718f:
      tcu::Surface::~Surface((Surface *)&x);
      if (local_888 == 0) {
        tcu::TestLog::operator<<(&local_a08,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_a08,
                            (char (*) [151])
                            "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first"
                           );
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_a08);
        tcu::Vector<float,_2>::Vector(&local_a10,-1.0,-1.0);
        tcu::Vector<float,_2>::Vector(&local_a18,1.0,-1.0);
        tcu::Vector<float,_2>::Vector(&local_a20,-1.0,1.0);
        tcu::Vector<float,_2>::Vector(&local_a28,1.0,1.0);
        tcu::Vector<float,_4>::Vector(&local_a38,1.0);
        MultisampleCase::renderQuad
                  (&this->super_MultisampleCase,&local_a10,&local_a18,&local_a20,&local_a28,
                   &local_a38);
        MultisampleCase::readImage(&this->super_MultisampleCase,(Surface *)local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae8,"RenderedImgSecond",&local_ae9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b10,"Second image rendered",&local_b11);
        tcu::LogImage::LogImage
                  (&local_ac8,&local_ae8,(string *)local_b10,(Surface *)local_50,
                   QP_IMAGE_COMPRESSION_MODE_PNG);
        tcu::TestLog::operator<<(this_00,&local_ac8);
        tcu::LogImage::~LogImage(&local_ac8);
        std::__cxx11::string::~string((string *)local_b10);
        std::allocator<char>::~allocator(&local_b11);
        std::__cxx11::string::~string((string *)&local_ae8);
        std::allocator<char>::~allocator(&local_ae9);
        tcu::RGBA::RGBA(&local_b18,0);
        local_b12 = tcu::pixelThresholdCompare
                              (this_00,"ImageCompare","Image comparison",
                               (Surface *)&renderedImgSecond.m_pixels.m_cap,(Surface *)local_50,
                               &local_b18,COMPARE_LOG_ON_ERROR);
        if ((bool)local_b12) {
          tcu::TestLog::operator<<(&local_c98,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_c98,
                              (char (*) [47])"Success: The two images rendered are identical");
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_c98);
        }
        pTVar7 = Context::getTestContext((this->super_MultisampleCase).super_TestCase.m_context);
        if ((local_b12 & 1) == 0) {
          local_e00 = "Failed";
        }
        else {
          local_e00 = "Passed";
        }
        tcu::TestContext::setTestResult(pTVar7,(uint)((local_b12 & 1) == 0),local_e00);
        this_local._4_4_ = STOP;
        local_888 = 1;
      }
      tcu::Surface::~Surface((Surface *)local_50);
      tcu::Surface::~Surface((Surface *)&renderedImgSecond.m_pixels.m_cap);
      return this_local._4_4_;
    }
    for (clr._0_4_ = 0; iVar1 = (int)clr, iVar5 = tcu::Surface::getWidth((Surface *)&x),
        iVar1 < iVar5; clr._0_4_ = (int)clr + 1) {
      local_624 = tcu::Surface::getPixel((Surface *)&x,(int)clr,clr._4_4_);
      local_620 = &local_624;
      local_628 = tcu::RGBA::black();
      bVar2 = tcu::RGBA::operator!=(&local_624,&local_628);
      if (bVar2) {
        tcu::TestLog::operator<<(&local_7a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_7a8,(char (*) [39])"Failure: first non-black pixel, color ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_620);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [28])", detected at coordinates (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&clr);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x12ed2ef);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&clr + 4));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x130f08e);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_7a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_858,"ClearedImg",&local_859);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_880,"Image after clearing, erroneously non-black",&local_881);
        tcu::LogImage::LogImage
                  (&local_838,&local_858,&local_880,(Surface *)&x,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::TestLog::operator<<(this_00,&local_838);
        tcu::LogImage::~LogImage(&local_838);
        std::__cxx11::string::~string((string *)&local_880);
        std::allocator<char>::~allocator(&local_881);
        std::__cxx11::string::~string((string *)&local_858);
        std::allocator<char>::~allocator(&local_859);
        pTVar7 = Context::getTestContext((this->super_MultisampleCase).super_TestCase.m_context);
        tcu::TestContext::setTestResult(pTVar7,QP_TEST_RESULT_FAIL,"Failed");
        this_local._4_4_ = STOP;
        local_888 = 1;
        goto LAB_00a4718f;
      }
    }
    clr._4_4_ = clr._4_4_ + 1;
  } while( true );
}

Assistant:

SampleStencilCase::IterateResult SampleStencilCase::iterate (void)
{
	TestLog&		log					= m_testCtx.getLog();
	tcu::Surface	renderedImgFirst	(m_viewportSize, m_viewportSize);
	tcu::Surface	renderedImgSecond	(m_viewportSize, m_viewportSize);

	randomizeViewport();

	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClearStencil(0));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT));
	GLU_CHECK_CALL(glEnable(GL_STENCIL_TEST));
	GLU_CHECK_CALL(glStencilFunc(GL_ALWAYS, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE));

	log << TestLog::Message << "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)" << TestLog::EndMessage;

	{
		const int numTriangles = 25;
		for (int i = 0; i < numTriangles; i++)
		{
			float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
			float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

			renderTriangle(Vec2(0.0f, 0.0f),
						   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
						   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
						   Vec4(1.0f));
		}
	}

	readImage(renderedImgFirst);
	log << TestLog::Image("RenderedImgFirst", "First image rendered", renderedImgFirst, QP_IMAGE_COMPRESSION_MODE_PNG);

	log << TestLog::Message << "Clearing color buffer to black" << TestLog::EndMessage;

	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glStencilFunc(GL_EQUAL, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP));

	{
		log << TestLog::Message << "Checking that color buffer was actually cleared to black" << TestLog::EndMessage;

		tcu::Surface clearedImg(m_viewportSize, m_viewportSize);
		readImage(clearedImg);

		for (int y = 0; y < clearedImg.getHeight(); y++)
		for (int x = 0; x < clearedImg.getWidth(); x++)
		{
			const tcu::RGBA& clr = clearedImg.getPixel(x, y);
			if (clr != tcu::RGBA::black())
			{
				log << TestLog::Message << "Failure: first non-black pixel, color " << clr << ", detected at coordinates (" << x << ", " << y << ")" << TestLog::EndMessage;
				log << TestLog::Image("ClearedImg", "Image after clearing, erroneously non-black", clearedImg);
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
				return STOP;
			}
		}
	}

	log << TestLog::Message << "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first" << TestLog::EndMessage;

	renderQuad(Vec2(-1.0f, -1.0f),
			   Vec2( 1.0f, -1.0f),
			   Vec2(-1.0f,  1.0f),
			   Vec2( 1.0f,  1.0f),
			   Vec4(1.0f));

	readImage(renderedImgSecond);
	log << TestLog::Image("RenderedImgSecond", "Second image rendered", renderedImgSecond, QP_IMAGE_COMPRESSION_MODE_PNG);

	bool passed = tcu::pixelThresholdCompare(log,
											 "ImageCompare",
											 "Image comparison",
											 renderedImgFirst,
											 renderedImgSecond,
											 tcu::RGBA(0),
											 tcu::COMPARE_LOG_ON_ERROR);

	if (passed)
		log << TestLog::Message << "Success: The two images rendered are identical" << TestLog::EndMessage;

	m_context.getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
											 passed ? "Passed"				: "Failed");

	return STOP;
}